

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::Clear(ImFont *this)

{
  ImVec2 local_18;
  ImFont *local_10;
  ImFont *this_local;
  
  this->FontSize = 0.0;
  local_10 = this;
  ImVec2::ImVec2(&local_18,0.0,1.0);
  this->DisplayOffset = local_18;
  this->ConfigData = (ImFontConfig *)0x0;
  this->ConfigDataCount = 0;
  this->Descent = 0.0;
  this->Ascent = 0.0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  ImVector<ImFont::Glyph>::clear(&this->Glyphs);
  this->FallbackGlyph = (Glyph *)0x0;
  this->FallbackXAdvance = 0.0;
  ImVector<float>::clear(&this->IndexXAdvance);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  return;
}

Assistant:

void    ImFont::Clear()
{
    FontSize = 0.0f;
    DisplayOffset = ImVec2(0.0f, 1.0f);
    ConfigData = NULL;
    ConfigDataCount = 0;
    Ascent = Descent = 0.0f;
    ContainerAtlas = NULL;
    Glyphs.clear();
    FallbackGlyph = NULL;
    FallbackXAdvance = 0.0f;
    IndexXAdvance.clear();
    IndexLookup.clear();
}